

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.cpp
# Opt level: O1

size_t __thiscall clickhouse::SocketInput::DoRead(SocketInput *this,void *buf,size_t len)

{
  int __v;
  size_t sVar1;
  system_error *this_00;
  int *piVar2;
  error_category *__ecat;
  
  sVar1 = recv(this->s_,buf,(long)(int)len,0);
  if (0 < (long)sVar1) {
    return sVar1;
  }
  this_00 = (system_error *)__cxa_allocate_exception(0x20);
  piVar2 = __errno_location();
  __v = *piVar2;
  __ecat = (error_category *)std::_V2::system_category();
  if (sVar1 == 0) {
    std::system_error::system_error(this_00,__v,__ecat,"closed");
  }
  else {
    std::system_error::system_error(this_00,__v,__ecat,"can\'t receive string data");
  }
  __cxa_throw(this_00,&std::system_error::typeinfo,std::system_error::~system_error);
}

Assistant:

size_t SocketInput::DoRead(void* buf, size_t len) {
    const ssize_t ret = ::recv(s_, (char*)buf, (int)len, 0);

    if (ret > 0) {
        return (size_t)ret;
    }

    if (ret == 0) {
        throw std::system_error(
            errno, std::system_category(), "closed"
        );
    }

    throw std::system_error(
        errno, std::system_category(), "can't receive string data"
    );
}